

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  undefined8 uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  parasail_result_t *ppVar9;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  __m128i *palVar13;
  ulong uVar14;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong size;
  undefined8 unaff_R13;
  long lVar19;
  ushort uVar20;
  short sVar21;
  ushort uVar22;
  undefined4 uVar23;
  ushort uVar42;
  ushort uVar45;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  undefined1 auVar25 [16];
  undefined4 uVar24;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i alVar29;
  ushort uVar39;
  ushort uVar51;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar40;
  short sVar43;
  short sVar46;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar41;
  ushort uVar44;
  ushort uVar47;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar52;
  uint uVar54;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  undefined1 auVar55 [16];
  ushort uVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar66;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  ushort uVar81;
  ushort uVar83;
  ushort uVar84;
  ushort uVar86;
  int iVar85;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  undefined1 auVar82 [16];
  undefined1 auVar91 [16];
  ushort uVar92;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  undefined1 auVar93 [16];
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  __m128i c;
  uint local_144;
  ushort local_118;
  ushort uStack_116;
  ushort local_98;
  ushort uStack_96;
  ushort local_48;
  ushort uStack_46;
  size_t len;
  undefined1 auVar32 [16];
  short sVar53;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar54 = profile->s1Len;
        uVar14 = (ulong)uVar54;
        if ((int)uVar54 < 1) {
          parasail_sw_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_scan_profile_sse2_128_16_cold_2();
        }
        else {
          if (-1 < gap) {
            iVar12 = ppVar5->min;
            iVar85 = -iVar12;
            if (iVar12 != -open && SBORROW4(iVar12,-open) == iVar12 + open < 0) {
              iVar85 = open;
            }
            iVar12 = ppVar5->max;
            ppVar9 = parasail_result_new();
            if (ppVar9 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar16 = uVar14 + 7;
            size = uVar16 >> 3;
            ppVar9->flag = ppVar9->flag | 0x8200404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            auVar25._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar25._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar25._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar25._12_4_ = -(uint)((int)__dest == 0 && (int)((ulong)__dest >> 0x20) == 0);
            iVar7 = movmskps((int)ptr_00,auVar25);
            if (iVar7 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar25 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar23 = auVar25._0_4_;
            auVar25 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar24 = auVar25._0_4_;
            local_144 = iVar85 - 0x7fff;
            auVar25 = pshuflw(ZEXT416(local_144),ZEXT416(local_144),0);
            auVar26 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R13 >> 0x10),0x7ffe - (short)iVar12
                                            ));
            auVar27 = pshuflw(auVar26,auVar26,0);
            uVar8 = local_144 & 0xffff;
            uVar17 = (uint)size;
            uVar11 = -(gap * uVar17);
            len = (size_t)uVar11;
            auVar26 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
            uVar11 = auVar26._0_4_;
            auVar28._0_8_ = CONCAT44(uVar11,uVar11);
            auVar28._8_4_ = uVar11;
            auVar28._12_4_ = uVar11;
            auVar64._0_8_ = auVar28._0_8_ << 0x10;
            auVar64._8_8_ = auVar28._8_8_ << 0x10 | (ulong)(uVar11 >> 0x10);
            auVar28 = paddsw(auVar64,ZEXT416(uVar8));
            alVar29[1] = extraout_RDX;
            alVar29[0] = size;
            parasail_memset___m128i(b_00,alVar29,len);
            c[1] = extraout_RDX_00;
            c[0] = size;
            parasail_memset___m128i(b,c,len);
            auVar26._4_4_ = uVar24;
            auVar26._0_4_ = uVar24;
            auVar26._8_4_ = uVar24;
            auVar26._12_4_ = uVar24;
            auVar75._4_4_ = uVar23;
            auVar75._0_4_ = uVar23;
            auVar75._8_4_ = uVar23;
            auVar75._12_4_ = uVar23;
            alVar29 = (__m128i)psubsw((undefined1  [16])0x0,auVar75);
            palVar13 = ptr_00 + (uVar17 - 1);
            uVar10 = size;
            do {
              *palVar13 = alVar29;
              alVar29 = (__m128i)psubsw((undefined1  [16])alVar29,auVar26);
              palVar13 = palVar13 + -1;
              iVar12 = (int)uVar10;
              uVar11 = iVar12 - 1;
              uVar10 = (ulong)uVar11;
            } while (uVar11 != 0 && 0 < iVar12);
            lVar19 = (ulong)(uVar17 + (uVar17 == 0)) << 4;
            uVar18 = 0;
            uVar10 = 0;
            local_118 = auVar25._0_2_;
            uStack_116 = auVar25._2_2_;
            local_98 = auVar27._0_2_;
            uStack_96 = auVar27._2_2_;
            uVar81 = local_118;
            uVar83 = uStack_116;
            uVar84 = local_118;
            uVar86 = uStack_116;
            uVar87 = local_118;
            uVar88 = uStack_116;
            uVar89 = local_118;
            uVar90 = uStack_116;
            uVar92 = local_118;
            uVar94 = uStack_116;
            uVar95 = local_118;
            uVar96 = uStack_116;
            uVar97 = local_118;
            uVar98 = uStack_116;
            uVar99 = local_118;
            uVar100 = uStack_116;
            local_48 = local_118;
            uStack_46 = uStack_116;
            uVar22 = local_118;
            uVar41 = uStack_116;
            uVar44 = local_118;
            uVar47 = uStack_116;
            uVar62 = local_118;
            uVar63 = uStack_116;
            uVar101 = local_98;
            uVar102 = uStack_96;
            uVar103 = local_98;
            uVar104 = uStack_96;
            uVar105 = local_98;
            uVar106 = uStack_96;
            uVar107 = local_98;
            uVar108 = uStack_96;
            do {
              iVar12 = ppVar5->mapper[(byte)s2[uVar18]];
              uVar6 = b_00[uVar17 - 1][0];
              auVar27._0_8_ = uVar6 << 0x10;
              auVar27._8_8_ = b_00[uVar17 - 1][1] << 0x10 | uVar6 >> 0x30;
              lVar15 = 0;
              auVar55 = (undefined1  [16])0x0;
              uVar20 = local_118;
              uVar39 = uStack_116;
              uVar42 = local_118;
              uVar45 = uStack_116;
              uVar48 = local_118;
              uVar49 = uStack_116;
              uVar50 = local_118;
              uVar51 = uStack_116;
              do {
                auVar25 = *(undefined1 (*) [16])((long)*b_00 + lVar15);
                auVar64 = paddsw(auVar27,*(undefined1 (*) [16])
                                          ((long)pvVar4 + lVar15 + (long)iVar12 * size * 0x10));
                auVar27 = paddsw(auVar55,*(undefined1 (*) [16])((long)*ptr_00 + lVar15));
                auVar55 = psubsw(*(undefined1 (*) [16])((long)*b + lVar15),auVar26);
                sVar53 = auVar27._0_2_;
                uVar20 = (ushort)((short)uVar20 < sVar53) * sVar53 |
                         ((short)uVar20 >= sVar53) * uVar20;
                sVar53 = auVar27._2_2_;
                uVar39 = (ushort)((short)uVar39 < sVar53) * sVar53 |
                         ((short)uVar39 >= sVar53) * uVar39;
                sVar53 = auVar27._4_2_;
                uVar42 = (ushort)((short)uVar42 < sVar53) * sVar53 |
                         ((short)uVar42 >= sVar53) * uVar42;
                sVar53 = auVar27._6_2_;
                uVar45 = (ushort)((short)uVar45 < sVar53) * sVar53 |
                         ((short)uVar45 >= sVar53) * uVar45;
                sVar53 = auVar27._8_2_;
                uVar48 = (ushort)((short)uVar48 < sVar53) * sVar53 |
                         ((short)uVar48 >= sVar53) * uVar48;
                sVar53 = auVar27._10_2_;
                uVar49 = (ushort)((short)uVar49 < sVar53) * sVar53 |
                         ((short)uVar49 >= sVar53) * uVar49;
                sVar53 = auVar27._12_2_;
                uVar50 = (ushort)((short)uVar50 < sVar53) * sVar53 |
                         ((short)uVar50 >= sVar53) * uVar50;
                sVar53 = auVar27._14_2_;
                uVar51 = (ushort)((short)uVar51 < sVar53) * sVar53 |
                         ((short)uVar51 >= sVar53) * uVar51;
                auVar27 = psubsw(auVar25,auVar75);
                sVar53 = auVar55._0_2_;
                sVar77 = auVar27._0_2_;
                uVar66 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._2_2_;
                sVar77 = auVar27._2_2_;
                uVar68 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._4_2_;
                sVar77 = auVar27._4_2_;
                uVar69 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._6_2_;
                sVar77 = auVar27._6_2_;
                uVar70 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._8_2_;
                sVar77 = auVar27._8_2_;
                uVar71 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._10_2_;
                sVar77 = auVar27._10_2_;
                uVar72 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._12_2_;
                sVar77 = auVar27._12_2_;
                sVar78 = auVar27._14_2_;
                uVar73 = (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar55._14_2_;
                uVar74 = (ushort)(sVar78 < sVar53) * sVar53 | (ushort)(sVar78 >= sVar53) * sVar78;
                sVar53 = auVar64._0_2_;
                uVar52 = (sVar53 < (short)uVar66) * uVar66 |
                         (ushort)(sVar53 >= (short)uVar66) * sVar53;
                sVar53 = auVar64._2_2_;
                uVar59 = (sVar53 < (short)uVar68) * uVar68 |
                         (ushort)(sVar53 >= (short)uVar68) * sVar53;
                sVar53 = auVar64._4_2_;
                uVar60 = (sVar53 < (short)uVar69) * uVar69 |
                         (ushort)(sVar53 >= (short)uVar69) * sVar53;
                sVar53 = auVar64._6_2_;
                uVar61 = (sVar53 < (short)uVar70) * uVar70 |
                         (ushort)(sVar53 >= (short)uVar70) * sVar53;
                auVar55._0_8_ = CONCAT26(uVar61,CONCAT24(uVar60,CONCAT22(uVar59,uVar52)));
                sVar53 = auVar64._8_2_;
                auVar55._8_2_ =
                     (sVar53 < (short)uVar71) * uVar71 | (ushort)(sVar53 >= (short)uVar71) * sVar53;
                sVar53 = auVar64._10_2_;
                auVar55._10_2_ =
                     (sVar53 < (short)uVar72) * uVar72 | (ushort)(sVar53 >= (short)uVar72) * sVar53;
                sVar53 = auVar64._12_2_;
                sVar77 = auVar64._14_2_;
                auVar55._12_2_ =
                     (sVar53 < (short)uVar73) * uVar73 | (ushort)(sVar53 >= (short)uVar73) * sVar53;
                auVar55._14_2_ =
                     (sVar77 < (short)uVar74) * uVar74 | (ushort)(sVar77 >= (short)uVar74) * sVar77;
                puVar1 = (ushort *)((long)*b + lVar15);
                *puVar1 = uVar66;
                puVar1[1] = uVar68;
                puVar1[2] = uVar69;
                puVar1[3] = uVar70;
                puVar1[4] = uVar71;
                puVar1[5] = uVar72;
                puVar1[6] = uVar73;
                puVar1[7] = uVar74;
                *(undefined1 (*) [16])((long)*ptr + lVar15) = auVar55;
                lVar15 = lVar15 + 0x10;
                auVar27 = auVar25;
              } while (lVar19 != lVar15);
              auVar56._0_8_ = auVar55._0_8_ << 0x10;
              auVar56._8_8_ = auVar55._8_8_ << 0x10 | (ulong)uVar61;
              auVar25 = paddsw((undefined1  [16])*ptr_00,auVar56);
              sVar53 = auVar25._0_2_;
              auVar30._0_2_ =
                   (ushort)((short)uVar20 < sVar53) * sVar53 | ((short)uVar20 >= sVar53) * uVar20;
              sVar53 = auVar25._2_2_;
              auVar30._2_2_ =
                   (ushort)((short)uVar39 < sVar53) * sVar53 | ((short)uVar39 >= sVar53) * uVar39;
              sVar53 = auVar25._4_2_;
              auVar30._4_2_ =
                   (ushort)((short)uVar42 < sVar53) * sVar53 | ((short)uVar42 >= sVar53) * uVar42;
              sVar53 = auVar25._6_2_;
              auVar30._6_2_ =
                   (ushort)((short)uVar45 < sVar53) * sVar53 | ((short)uVar45 >= sVar53) * uVar45;
              sVar53 = auVar25._8_2_;
              auVar30._8_2_ =
                   (ushort)((short)uVar48 < sVar53) * sVar53 | ((short)uVar48 >= sVar53) * uVar48;
              sVar53 = auVar25._10_2_;
              auVar30._10_2_ =
                   (ushort)((short)uVar49 < sVar53) * sVar53 | ((short)uVar49 >= sVar53) * uVar49;
              sVar53 = auVar25._12_2_;
              auVar30._12_2_ =
                   (ushort)((short)uVar50 < sVar53) * sVar53 | ((short)uVar50 >= sVar53) * uVar50;
              sVar53 = auVar25._14_2_;
              auVar30._14_2_ =
                   (ushort)((short)uVar51 < sVar53) * sVar53 | ((short)uVar51 >= sVar53) * uVar51;
              iVar12 = 6;
              do {
                auVar31._0_8_ = auVar30._0_8_ << 0x10;
                auVar31._8_8_ = auVar30._8_8_ << 0x10 | auVar30._0_8_ >> 0x30;
                auVar25 = paddsw(auVar31,auVar28);
                sVar53 = auVar30._0_2_;
                sVar21 = auVar25._0_2_;
                sVar77 = auVar30._2_2_;
                sVar40 = auVar25._2_2_;
                sVar78 = auVar30._4_2_;
                sVar43 = auVar25._4_2_;
                sVar79 = auVar30._6_2_;
                sVar46 = auVar25._6_2_;
                uVar20 = (ushort)(sVar46 < sVar79) * sVar79 | (ushort)(sVar46 >= sVar79) * sVar46;
                auVar32._0_8_ =
                     CONCAT26(uVar20,CONCAT24((ushort)(sVar43 < sVar78) * sVar78 |
                                              (ushort)(sVar43 >= sVar78) * sVar43,
                                              CONCAT22((ushort)(sVar40 < sVar77) * sVar77 |
                                                       (ushort)(sVar40 >= sVar77) * sVar40,
                                                       (ushort)(sVar21 < sVar53) * sVar53 |
                                                       (ushort)(sVar21 >= sVar53) * sVar21)));
                sVar53 = auVar30._8_2_;
                sVar77 = auVar25._8_2_;
                auVar32._8_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar30._10_2_;
                sVar77 = auVar25._10_2_;
                auVar32._10_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar30._12_2_;
                sVar77 = auVar25._12_2_;
                sVar78 = auVar25._14_2_;
                auVar32._12_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar30._14_2_;
                auVar32._14_2_ =
                     (ushort)(sVar78 < sVar53) * sVar53 | (ushort)(sVar78 >= sVar53) * sVar78;
                iVar12 = iVar12 + -1;
                auVar30 = auVar32;
              } while (iVar12 != 0);
              auVar33._0_8_ = auVar32._0_8_ << 0x10;
              auVar33._8_8_ = auVar32._8_8_ << 0x10 | (ulong)uVar20;
              auVar34 = paddsw(auVar33,ZEXT416(uVar8));
              sVar40 = (-1 < (short)uVar52) * uVar52;
              sVar43 = (-1 < (short)uVar59) * uVar59;
              sVar79 = (-1 < auVar56._0_8_) * uVar60;
              sVar78 = (-1 < (short)uVar61) * uVar61;
              sVar77 = (-1 < (short)auVar55._8_2_) * auVar55._8_2_;
              sVar53 = (-1 < (short)auVar55._10_2_) * auVar55._10_2_;
              sVar21 = (-1 < (long)auVar56._8_8_) * auVar55._12_2_;
              sVar46 = auVar34._2_2_;
              auVar57._2_2_ =
                   (ushort)(sVar40 < sVar46) * sVar46 | (ushort)(sVar40 >= sVar46) * sVar40;
              auVar57._0_2_ = (ushort)(0 < auVar34._0_2_) * auVar34._0_2_;
              sVar40 = auVar34._4_2_;
              auVar57._4_2_ =
                   (ushort)(sVar43 < sVar40) * sVar40 | (ushort)(sVar43 >= sVar40) * sVar43;
              sVar40 = auVar34._6_2_;
              auVar57._6_2_ =
                   (ushort)(sVar79 < sVar40) * sVar40 | (ushort)(sVar79 >= sVar40) * sVar79;
              sVar79 = auVar34._8_2_;
              auVar57._8_2_ =
                   (ushort)(sVar78 < sVar79) * sVar79 | (ushort)(sVar78 >= sVar79) * sVar78;
              sVar78 = auVar34._10_2_;
              auVar57._10_2_ =
                   (ushort)(sVar77 < sVar78) * sVar78 | (ushort)(sVar77 >= sVar78) * sVar77;
              sVar77 = auVar34._12_2_;
              auVar57._12_2_ =
                   (ushort)(sVar53 < sVar77) * sVar77 | (ushort)(sVar53 >= sVar77) * sVar53;
              sVar53 = auVar34._14_2_;
              auVar57._14_2_ =
                   (ushort)(sVar21 < sVar53) * sVar53 | (ushort)(sVar21 >= sVar53) * sVar21;
              lVar15 = 0;
              do {
                auVar25 = psubsw(auVar34,auVar26);
                auVar27 = psubsw(auVar57,auVar75);
                sVar53 = auVar27._0_2_;
                sVar77 = auVar25._0_2_;
                auVar34._0_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._2_2_;
                sVar77 = auVar25._2_2_;
                auVar34._2_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._4_2_;
                sVar77 = auVar25._4_2_;
                auVar34._4_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._6_2_;
                sVar77 = auVar25._6_2_;
                auVar34._6_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._8_2_;
                sVar77 = auVar25._8_2_;
                auVar34._8_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._10_2_;
                sVar77 = auVar25._10_2_;
                auVar34._10_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._12_2_;
                sVar77 = auVar25._12_2_;
                sVar78 = auVar25._14_2_;
                auVar34._12_2_ =
                     (ushort)(sVar77 < sVar53) * sVar53 | (ushort)(sVar77 >= sVar53) * sVar77;
                sVar53 = auVar27._14_2_;
                auVar34._14_2_ =
                     (ushort)(sVar78 < sVar53) * sVar53 | (ushort)(sVar78 >= sVar53) * sVar78;
                psVar2 = (short *)((long)*ptr + lVar15);
                sVar53 = *psVar2;
                sVar77 = psVar2[1];
                sVar78 = psVar2[2];
                sVar79 = psVar2[3];
                sVar21 = psVar2[4];
                sVar40 = psVar2[5];
                sVar43 = psVar2[6];
                sVar46 = psVar2[7];
                uVar20 = (sVar53 < (short)auVar34._0_2_) * auVar34._0_2_ |
                         (ushort)(sVar53 >= (short)auVar34._0_2_) * sVar53;
                uVar39 = (sVar77 < (short)auVar34._2_2_) * auVar34._2_2_ |
                         (ushort)(sVar77 >= (short)auVar34._2_2_) * sVar77;
                uVar42 = (sVar78 < (short)auVar34._4_2_) * auVar34._4_2_ |
                         (ushort)(sVar78 >= (short)auVar34._4_2_) * sVar78;
                uVar45 = (sVar79 < (short)auVar34._6_2_) * auVar34._6_2_ |
                         (ushort)(sVar79 >= (short)auVar34._6_2_) * sVar79;
                uVar48 = (sVar21 < (short)auVar34._8_2_) * auVar34._8_2_ |
                         (ushort)(sVar21 >= (short)auVar34._8_2_) * sVar21;
                uVar49 = (sVar40 < (short)auVar34._10_2_) * auVar34._10_2_ |
                         (ushort)(sVar40 >= (short)auVar34._10_2_) * sVar40;
                uVar50 = (sVar43 < (short)auVar34._12_2_) * auVar34._12_2_ |
                         (ushort)(sVar43 >= (short)auVar34._12_2_) * sVar43;
                uVar51 = (sVar46 < (short)auVar34._14_2_) * auVar34._14_2_ |
                         (ushort)(sVar46 >= (short)auVar34._14_2_) * sVar46;
                sVar77 = (-1 < (short)uVar20) * uVar20;
                sVar78 = (-1 < (short)uVar39) * uVar39;
                auVar57._2_2_ = sVar78;
                auVar57._0_2_ = sVar77;
                sVar79 = (-1 < (short)uVar42) * uVar42;
                auVar57._4_2_ = sVar79;
                sVar40 = (-1 < (short)uVar45) * uVar45;
                auVar57._6_2_ = sVar40;
                sVar21 = (-1 < (short)uVar48) * uVar48;
                auVar57._8_2_ = sVar21;
                sVar43 = (-1 < (short)uVar49) * uVar49;
                auVar57._10_2_ = sVar43;
                sVar46 = (-1 < (short)uVar50) * uVar50;
                auVar57._12_2_ = sVar46;
                sVar53 = (-1 < (short)uVar51) * uVar51;
                auVar57._14_2_ = sVar53;
                *(undefined1 (*) [16])((long)*b_00 + lVar15) = auVar57;
                uVar101 = (ushort)(sVar77 < (short)uVar101) * sVar77 |
                          (sVar77 >= (short)uVar101) * uVar101;
                uVar102 = (ushort)(sVar78 < (short)uVar102) * sVar78 |
                          (sVar78 >= (short)uVar102) * uVar102;
                uVar103 = (ushort)(sVar79 < (short)uVar103) * sVar79 |
                          (sVar79 >= (short)uVar103) * uVar103;
                uVar104 = (ushort)(sVar40 < (short)uVar104) * sVar40 |
                          (sVar40 >= (short)uVar104) * uVar104;
                uVar105 = (ushort)(sVar21 < (short)uVar105) * sVar21 |
                          (sVar21 >= (short)uVar105) * uVar105;
                uVar106 = (ushort)(sVar43 < (short)uVar106) * sVar43 |
                          (sVar43 >= (short)uVar106) * uVar106;
                uVar107 = (ushort)(sVar46 < (short)uVar107) * sVar46 |
                          (sVar46 >= (short)uVar107) * uVar107;
                uVar108 = (ushort)(sVar53 < (short)uVar108) * sVar53 |
                          (sVar53 >= (short)uVar108) * uVar108;
                uVar92 = (ushort)((short)uVar92 < sVar77) * sVar77 |
                         ((short)uVar92 >= sVar77) * uVar92;
                uVar94 = (ushort)((short)uVar94 < sVar78) * sVar78 |
                         ((short)uVar94 >= sVar78) * uVar94;
                uVar95 = (ushort)((short)uVar95 < sVar79) * sVar79 |
                         ((short)uVar95 >= sVar79) * uVar95;
                uVar96 = (ushort)((short)uVar96 < sVar40) * sVar40 |
                         ((short)uVar96 >= sVar40) * uVar96;
                uVar97 = (ushort)((short)uVar97 < sVar21) * sVar21 |
                         ((short)uVar97 >= sVar21) * uVar97;
                uVar98 = (ushort)((short)uVar98 < sVar43) * sVar43 |
                         ((short)uVar98 >= sVar43) * uVar98;
                uVar99 = (ushort)((short)uVar99 < sVar46) * sVar46 |
                         ((short)uVar99 >= sVar46) * uVar99;
                uVar100 = (ushort)((short)uVar100 < sVar53) * sVar53 |
                          ((short)uVar100 >= sVar53) * uVar100;
                uVar81 = (ushort)((short)uVar81 < sVar77) * sVar77 |
                         ((short)uVar81 >= sVar77) * uVar81;
                uVar83 = (ushort)((short)uVar83 < sVar78) * sVar78 |
                         ((short)uVar83 >= sVar78) * uVar83;
                uVar84 = (ushort)((short)uVar84 < sVar79) * sVar79 |
                         ((short)uVar84 >= sVar79) * uVar84;
                uVar86 = (ushort)((short)uVar86 < sVar40) * sVar40 |
                         ((short)uVar86 >= sVar40) * uVar86;
                uVar87 = (ushort)((short)uVar87 < sVar21) * sVar21 |
                         ((short)uVar87 >= sVar21) * uVar87;
                uVar88 = (ushort)((short)uVar88 < sVar43) * sVar43 |
                         ((short)uVar88 >= sVar43) * uVar88;
                uVar89 = (ushort)((short)uVar89 < sVar46) * sVar46 |
                         ((short)uVar89 >= sVar46) * uVar89;
                uVar90 = (ushort)((short)uVar90 < sVar53) * sVar53 |
                         ((short)uVar90 >= sVar53) * uVar90;
                lVar15 = lVar15 + 0x10;
              } while (lVar19 != lVar15);
              auVar35._0_2_ = -(ushort)((short)local_48 < (short)uVar81);
              auVar35._2_2_ = -(ushort)((short)uStack_46 < (short)uVar83);
              auVar35._4_2_ = -(ushort)((short)uVar22 < (short)uVar84);
              auVar35._6_2_ = -(ushort)((short)uVar41 < (short)uVar86);
              auVar35._8_2_ = -(ushort)((short)uVar44 < (short)uVar87);
              auVar35._10_2_ = -(ushort)((short)uVar47 < (short)uVar88);
              auVar35._12_2_ = -(ushort)((short)uVar62 < (short)uVar89);
              auVar35._14_2_ = -(ushort)((short)uVar63 < (short)uVar90);
              if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar35 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar35 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar35 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar35 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar35 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar35 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35._14_2_ >> 7 & 1) != 0) || (auVar35._14_2_ & 0x8000) != 0) {
                uVar22 = ((short)uVar87 < (short)uVar81) * uVar81 |
                         ((short)uVar87 >= (short)uVar81) * uVar87;
                uVar41 = ((short)uVar88 < (short)uVar83) * uVar83 |
                         ((short)uVar88 >= (short)uVar83) * uVar88;
                uVar44 = ((short)uVar89 < (short)uVar84) * uVar84 |
                         ((short)uVar89 >= (short)uVar84) * uVar89;
                uVar47 = ((short)uVar90 < (short)uVar86) * uVar86 |
                         ((short)uVar90 >= (short)uVar86) * uVar90;
                sVar77 = (0 < (short)uVar87) * uVar87;
                sVar53 = (0 < (short)uVar88) * uVar88;
                sVar79 = (0 < (short)uVar89) * uVar89;
                sVar78 = (0 < (short)uVar90) * uVar90;
                uVar22 = ((short)uVar44 < (short)uVar22) * uVar22 |
                         ((short)uVar44 >= (short)uVar22) * uVar44;
                uVar41 = ((short)uVar47 < (short)uVar41) * uVar41 |
                         ((short)uVar47 >= (short)uVar41) * uVar47;
                uVar44 = (sVar77 < (short)uVar44) * uVar44 |
                         (ushort)(sVar77 >= (short)uVar44) * sVar77;
                uVar47 = (sVar53 < (short)uVar47) * uVar47 |
                         (ushort)(sVar53 >= (short)uVar47) * sVar53;
                uVar62 = (ushort)(sVar79 < sVar77) * sVar77 | (ushort)(sVar79 >= sVar77) * sVar79;
                uVar63 = (ushort)(sVar78 < sVar53) * sVar53 | (ushort)(sVar78 >= sVar53) * sVar78;
                sVar79 = (ushort)(0 < sVar79) * sVar79;
                sVar78 = (ushort)(0 < sVar78) * sVar78;
                auVar36._0_4_ =
                     CONCAT22(((short)uVar44 < (short)uVar41) * uVar41 |
                              ((short)uVar44 >= (short)uVar41) * uVar44,
                              ((short)uVar41 < (short)uVar22) * uVar22 |
                              ((short)uVar41 >= (short)uVar22) * uVar41);
                auVar36._4_2_ =
                     ((short)uVar47 < (short)uVar44) * uVar44 |
                     ((short)uVar47 >= (short)uVar44) * uVar47;
                auVar36._6_2_ =
                     ((short)uVar62 < (short)uVar47) * uVar47 |
                     ((short)uVar62 >= (short)uVar47) * uVar62;
                auVar36._8_2_ =
                     ((short)uVar63 < (short)uVar62) * uVar62 |
                     ((short)uVar63 >= (short)uVar62) * uVar63;
                auVar36._10_2_ =
                     (sVar79 < (short)uVar63) * uVar63 | (ushort)(sVar79 >= (short)uVar63) * sVar79;
                auVar36._12_2_ =
                     (ushort)(sVar78 < sVar79) * sVar79 | (ushort)(sVar78 >= sVar79) * sVar78;
                auVar36._14_2_ = (ushort)(0 < sVar78) * sVar78;
                auVar25 = pshuflw(auVar36,auVar36,0);
                memcpy(__dest,b_00,size << 4);
                local_48 = auVar25._0_2_;
                uStack_46 = auVar25._2_2_;
                uVar10 = uVar18 & 0xffffffff;
                uVar22 = local_48;
                uVar41 = uStack_46;
                uVar44 = local_48;
                uVar47 = uStack_46;
                uVar62 = local_48;
                uVar63 = uStack_46;
                local_144 = auVar36._0_4_;
              }
              iVar12 = (int)uVar10;
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uint)s2Len);
            sVar53 = (short)local_144;
            if ((uVar16 & 0x7ffffff8) != 0) {
              if ((uVar16 & 0x7ffffff8) == 0) {
                uVar16 = 0;
                do {
                  if ((*(short *)((long)*__dest + uVar16 * 2) == sVar53) &&
                     (uVar54 = ((uint)uVar16 & 7) * uVar17 | (uint)(uVar16 >> 3) & 0x1fffffff,
                     (int)uVar54 < (int)uVar14)) {
                    uVar14 = (ulong)uVar54;
                  }
                  uVar54 = (uint)uVar14;
                  uVar16 = uVar16 + 1;
                } while ((uVar17 & 0xfffffff) << 3 != (int)uVar16);
              }
              else {
                auVar37._4_4_ = uVar54;
                auVar37._0_4_ = uVar54;
                auVar37._8_4_ = uVar54;
                auVar37._12_4_ = uVar54;
                auVar25 = pshuflw(ZEXT416(local_144),ZEXT416(local_144),0);
                uVar14 = 0;
                auVar67 = _DAT_00904a60;
                do {
                  uVar3 = *(undefined8 *)((long)*__dest + uVar14 * 2);
                  auVar76._0_2_ = -(ushort)((short)uVar3 == auVar25._0_2_);
                  sVar77 = -(ushort)((short)((ulong)uVar3 >> 0x10) == auVar25._2_2_);
                  sVar78 = -(ushort)((short)((ulong)uVar3 >> 0x20) == auVar25._4_2_);
                  sVar79 = -(ushort)((short)((ulong)uVar3 >> 0x30) == auVar25._6_2_);
                  auVar76._8_8_ =
                       (undefined8)
                       (CONCAT64(CONCAT42(CONCAT22(sVar79,sVar79),sVar78),CONCAT22(sVar78,sVar79))
                       >> 0x10);
                  auVar76._6_2_ = sVar77;
                  auVar76._4_2_ = sVar77;
                  auVar76._2_2_ = auVar76._0_2_;
                  uVar54 = auVar67._4_4_;
                  uVar8 = auVar67._8_4_;
                  uVar11 = auVar67._12_4_;
                  auVar26 = auVar67 & _DAT_00904b30;
                  iVar85 = auVar26._4_4_;
                  auVar91._4_4_ = iVar85;
                  auVar91._0_4_ = iVar85;
                  auVar91._8_4_ = auVar26._12_4_;
                  auVar91._12_4_ = auVar26._12_4_;
                  auVar82._0_4_ = auVar26._0_4_ * uVar17 + (auVar67._0_4_ >> 3);
                  auVar82._4_4_ = iVar85 * uVar17 + (uVar54 >> 3);
                  auVar82._8_4_ = (int)((auVar26._8_8_ & 0xffffffff) * size) + (uVar8 >> 3);
                  auVar82._12_4_ = (int)((auVar91._8_8_ & 0xffffffff) * size) + (uVar11 >> 3);
                  auVar80._0_4_ = -(uint)(auVar82._0_4_ < auVar37._0_4_);
                  auVar80._4_4_ = -(uint)(auVar82._4_4_ < auVar37._4_4_);
                  auVar80._8_4_ = -(uint)(auVar82._8_4_ < auVar37._8_4_);
                  auVar80._12_4_ = -(uint)(auVar82._12_4_ < auVar37._12_4_);
                  auVar37 = ~auVar76 & auVar37 | (~auVar80 & auVar37 | auVar82 & auVar80) & auVar76;
                  uVar14 = uVar14 + 4;
                  auVar67._0_4_ = auVar67._0_4_ + 4;
                  auVar67._4_4_ = uVar54 + 4;
                  auVar67._8_4_ = uVar8 + 4;
                  auVar67._12_4_ = uVar11 + 4;
                } while (((uint)uVar16 & 0x7ffffff8) != uVar14);
                auVar58._0_8_ = auVar37._8_8_;
                auVar58._8_4_ = auVar37._8_4_;
                auVar58._12_4_ = auVar37._12_4_;
                auVar65._0_4_ = -(uint)(auVar37._0_4_ < auVar37._8_4_);
                auVar65._4_4_ = -(uint)(auVar37._4_4_ < auVar37._12_4_);
                auVar65._8_8_ = 0;
                auVar25 = ~auVar65 & auVar58 | auVar37 & auVar65;
                uVar8 = auVar25._0_4_;
                uVar11 = auVar25._4_4_;
                uVar54 = -(uint)((int)uVar8 < (int)uVar11);
                uVar54 = ~uVar54 & uVar11 | uVar8 & uVar54;
              }
            }
            auVar38._0_2_ = -(ushort)((short)uVar101 < (short)local_118);
            auVar38._2_2_ = -(ushort)((short)uVar102 < (short)uStack_116);
            auVar38._4_2_ = -(ushort)((short)uVar103 < (short)local_118);
            auVar38._6_2_ = -(ushort)((short)uVar104 < (short)uStack_116);
            auVar38._8_2_ = -(ushort)((short)uVar105 < (short)local_118);
            auVar38._10_2_ = -(ushort)((short)uVar106 < (short)uStack_116);
            auVar38._12_2_ = -(ushort)((short)uVar107 < (short)local_118);
            auVar38._14_2_ = -(ushort)((short)uVar108 < (short)uStack_116);
            auVar93._0_2_ = -(ushort)((short)local_98 < (short)uVar92);
            auVar93._2_2_ = -(ushort)((short)uStack_96 < (short)uVar94);
            auVar93._4_2_ = -(ushort)((short)local_98 < (short)uVar95);
            auVar93._6_2_ = -(ushort)((short)uStack_96 < (short)uVar96);
            auVar93._8_2_ = -(ushort)((short)local_98 < (short)uVar97);
            auVar93._10_2_ = -(ushort)((short)uStack_96 < (short)uVar98);
            auVar93._12_2_ = -(ushort)((short)local_98 < (short)uVar99);
            auVar93._14_2_ = -(ushort)((short)uStack_96 < (short)uVar100);
            auVar93 = auVar93 | auVar38;
            if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar93 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar93 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar93 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar93 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar93 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar93 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar93 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar93 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar93 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar93 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar93 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar93[0xf] < '\0') {
              *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
              sVar53 = 0;
              iVar12 = 0;
              uVar54 = 0;
            }
            ppVar9->score = (int)sVar53;
            ppVar9->end_query = uVar54;
            ppVar9->end_ref = iVar12;
            parasail_free(ptr_00);
            parasail_free(__dest);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar9;
          }
          parasail_sw_scan_profile_sse2_128_16_cold_1();
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}